

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2i.c
# Opt level: O0

int Int2_ManChainResolve(Int2_Man_t *p,clause *c,int iLit,int varA)

{
  int iLit1;
  int iLit2;
  int varA_local;
  int iLit_local;
  clause *c_local;
  Int2_Man_t *p_local;
  
  iLit1 = Int2_ManChainStart(p,c);
  if (-1 < iLit) {
    if (varA == 0) {
      iLit2 = Gia_ManHashAnd(p->pGia,iLit,iLit1);
    }
    else {
      iLit2 = Gia_ManHashOr(p->pGia,iLit,iLit1);
    }
    return iLit2;
  }
  __assert_fail("iLit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2i.c"
                ,0x89,"int Int2_ManChainResolve(Int2_Man_t *, clause *, int, int)");
}

Assistant:

int Int2_ManChainResolve( Int2_Man_t * p, clause * c, int iLit, int varA )
{
    int iLit2 = Int2_ManChainStart( p, c );
    assert( iLit >= 0 );
    if ( varA )
        iLit = Gia_ManHashOr( p->pGia, iLit, iLit2 );
    else
        iLit = Gia_ManHashAnd( p->pGia, iLit, iLit2 );
    return iLit;
}